

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::TraceExecutionMode(FunctionBody *this,char *eventDescription)

{
  uint sourceContextId;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionInfo *pFVar4;
  
  FunctionExecutionStateMachine::AssertIsInitialized(&this->executionState);
  pFVar4 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  sourceContextId =
       ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->m_srcInfo
          ).ptr)->sourceContextInfo).ptr)->sourceContextId;
  if (pFVar4 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pFVar4 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015b6718,ExecutionModePhase,sourceContextId,
                            pFVar4->functionId);
  if (bVar2) {
    DoTraceExecutionMode(this,eventDescription);
    return;
  }
  return;
}

Assistant:

void FunctionBody::TraceExecutionMode(const char *const eventDescription) const
    {
        executionState.AssertIsInitialized();

        if(PHASE_TRACE(Phase::ExecutionModePhase, this))
        {
            DoTraceExecutionMode(eventDescription);
        }
    }